

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeSymbolConstructor
               (DynamicObject *symbolConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  JavascriptSymbol *pJVar3;
  ScriptConfiguration *pSVar4;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *symbolConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,symbolConstructor,mode,0x10,0);
  this = RecyclableObject::GetLibrary(&symbolConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&symbolConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(0);
  AddMember(this,symbolConstructor,0xd1,value,'\x02');
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).symbolPrototype);
  AddMember(this,symbolConstructor,0x124,*ppDVar2,'\0');
  value_00 = ScriptContext::GetPropertyString(this_00,0x166);
  AddMember(this,symbolConstructor,0x106,value_00,'\x02');
  pJVar3 = JavascriptLibraryBase::GetSymbolHasInstance(&this->super_JavascriptLibraryBase);
  AddMember(this,symbolConstructor,0xb5,pJVar3,'\0');
  pSVar4 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6IsConcatSpreadableEnabled(pSVar4);
  if (bVar1) {
    pJVar3 = JavascriptLibraryBase::GetSymbolIsConcatSpreadable(&this->super_JavascriptLibraryBase);
    AddMember(this,symbolConstructor,0xbf,pJVar3,'\0');
  }
  pJVar3 = JavascriptLibraryBase::GetSymbolIterator(&this->super_JavascriptLibraryBase);
  AddMember(this,symbolConstructor,0xcb,pJVar3,'\0');
  pSVar4 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES2018AsyncIterationEnabled(pSVar4);
  if (bVar1) {
    pJVar3 = JavascriptLibraryBase::GetSymbolAsyncIterator(&this->super_JavascriptLibraryBase);
    AddMember(this,symbolConstructor,0x44,pJVar3,'\0');
  }
  pJVar3 = GetSymbolSpecies(this);
  AddMember(this,symbolConstructor,0x154,pJVar3,'\0');
  pSVar4 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToPrimitiveEnabled(pSVar4);
  if (bVar1) {
    pJVar3 = JavascriptLibraryBase::GetSymbolToPrimitive(&this->super_JavascriptLibraryBase);
    AddMember(this,symbolConstructor,0x177,pJVar3,'\0');
  }
  pSVar4 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(pSVar4);
  if (bVar1) {
    pJVar3 = JavascriptLibraryBase::GetSymbolToStringTag(&this->super_JavascriptLibraryBase);
    AddMember(this,symbolConstructor,0x179,pJVar3,'\0');
  }
  pJVar3 = JavascriptLibraryBase::GetSymbolUnscopables(&this->super_JavascriptLibraryBase);
  AddMember(this,symbolConstructor,0x189,pJVar3,'\0');
  pSVar4 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(pSVar4);
  if (bVar1) {
    pJVar3 = GetSymbolMatch(this);
    AddMember(this,symbolConstructor,0x101,pJVar3,'\0');
    pJVar3 = GetSymbolReplace(this);
    AddMember(this,symbolConstructor,0x133,pJVar3,'\0');
    pJVar3 = GetSymbolSearch(this);
    AddMember(this,symbolConstructor,0x13c,pJVar3,'\0');
    pJVar3 = GetSymbolSplit(this);
    AddMember(this,symbolConstructor,0x156,pJVar3,'\0');
  }
  AddFunctionToLibraryObject
            (this,symbolConstructor,0x92,(FunctionInfo *)JavascriptSymbol::EntryInfo::For,1,'\x06');
  AddFunctionToLibraryObject
            (this,symbolConstructor,0xce,(FunctionInfo *)JavascriptSymbol::EntryInfo::KeyFor,1,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(symbolConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSymbolConstructor(DynamicObject* symbolConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(symbolConstructor, mode, 16);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSymbol
        // so that the update is in sync with profiler
        JavascriptLibrary* library = symbolConstructor->GetLibrary();
        ScriptContext* scriptContext = symbolConstructor->GetScriptContext();
        library->AddMember(symbolConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(symbolConstructor, PropertyIds::prototype, library->symbolPrototype, PropertyNone);
        library->AddMember(symbolConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Symbol), PropertyConfigurable);
        library->AddMember(symbolConstructor, PropertyIds::hasInstance, library->GetSymbolHasInstance(), PropertyNone);
        if (scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::isConcatSpreadable, library->GetSymbolIsConcatSpreadable(), PropertyNone);
        }
        library->AddMember(symbolConstructor, PropertyIds::iterator, library->GetSymbolIterator(), PropertyNone);
        if (scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::asyncIterator, library->GetSymbolAsyncIterator(), PropertyNone);
        }

        library->AddMember(symbolConstructor, PropertyIds::species, library->GetSymbolSpecies(), PropertyNone);

        if (scriptContext->GetConfig()->IsES6ToPrimitiveEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::toPrimitive, library->GetSymbolToPrimitive(), PropertyNone);
        }

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::toStringTag, library->GetSymbolToStringTag(), PropertyNone);
        }
        library->AddMember(symbolConstructor, PropertyIds::unscopables, library->GetSymbolUnscopables(), PropertyNone);

        if (scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::match, library->GetSymbolMatch(), PropertyNone);
            library->AddMember(symbolConstructor, PropertyIds::replace, library->GetSymbolReplace(), PropertyNone);
            library->AddMember(symbolConstructor, PropertyIds::search, library->GetSymbolSearch(), PropertyNone);
            library->AddMember(symbolConstructor, PropertyIds::split, library->GetSymbolSplit(), PropertyNone);
        }

        library->AddFunctionToLibraryObject(symbolConstructor, PropertyIds::for_, &JavascriptSymbol::EntryInfo::For, 1);
        library->AddFunctionToLibraryObject(symbolConstructor, PropertyIds::keyFor, &JavascriptSymbol::EntryInfo::KeyFor, 1);

        symbolConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }